

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkSets.c
# Opt level: O0

void Lpk_PrintSets(Vec_Int_t *vSets)

{
  uint uVar1;
  int iVar2;
  int local_1c;
  int i;
  int Number;
  uint uSupport;
  Vec_Int_t *vSets_local;
  
  uVar1 = Vec_IntSize(vSets);
  printf("Subsets(%d): ",(ulong)uVar1);
  for (local_1c = 0; iVar2 = Vec_IntSize(vSets), local_1c < iVar2; local_1c = local_1c + 1) {
    iVar2 = Vec_IntEntry(vSets,local_1c);
    Lpk_PrintSetOne(iVar2);
  }
  printf("\n");
  return;
}

Assistant:

static void Lpk_PrintSets( Vec_Int_t * vSets )
{
    unsigned uSupport;
    int Number, i;
    printf( "Subsets(%d): ", Vec_IntSize(vSets) );
    Vec_IntForEachEntry( vSets, Number, i )
    {
        uSupport = Number;
        Lpk_PrintSetOne( uSupport );
    }
    printf( "\n" );
}